

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppiVar1;
  pointer piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  vector<int_*,_std::allocator<int_*>_> pointers;
  vector<int,_std::allocator<int>_> data;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_78;
  int local_6c;
  vector<int_*,_std::allocator<int_*>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: random-accesses <shuffle> <size>",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string((string *)&local_50,argv[1],(allocator *)&local_78);
  piVar2 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = __errno_location();
  iVar7 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol((char *)piVar2,(char **)&local_68,10);
  if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)piVar2) {
    std::__throw_invalid_argument("stoi");
LAB_001025c1:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_001025c1;
    if (*piVar3 == 0) {
      *piVar3 = iVar7;
    }
    ppiVar1 = &local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if ((pointer *)
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar1) {
      operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::string((string *)&local_50,argv[2],(allocator *)&local_78);
    piVar2 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_6c = *piVar3;
    *piVar3 = 0;
    lVar5 = strtol((char *)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,(char **)&local_68,10);
    if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)piVar2) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = local_6c;
        }
        uVar8 = (int)lVar5 >> 2;
        if ((pointer *)
            local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ppiVar1) {
          operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)local_68.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_50,(long)(int)uVar8,(value_type_conflict *)&local_68,
                   (allocator_type *)&local_78);
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (int **)0x0;
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int **)0x0;
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int **)0x0;
        if (0 < (int)uVar8) {
          lVar5 = 0;
          iVar7 = 0;
          do {
            *(int *)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar5) = iVar7;
            local_78._M_x =
                 (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5;
            if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                        ((vector<int*,std::allocator<int*>> *)&local_68,
                         (iterator)
                         local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int **)&local_78);
            }
            else {
              *local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (int *)local_78._M_x;
              local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar7 = iVar7 + 1;
            lVar5 = lVar5 + 4;
          } while ((ulong)uVar8 << 2 != lVar5);
        }
        if ((int)lVar4 == 1) {
          local_78._M_x = 1;
          std::
          shuffle<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    ((__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                     local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                     local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_78);
        }
        test_memory(&local_68);
        if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start != (int **)0x0) {
          operator_delete(local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
      goto LAB_001025d9;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001025d9:
  uVar6 = std::__throw_out_of_range("stoi");
  if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: random-accesses <shuffle> <size>" << std::endl;
        return 1;
    }

    int shuffle = std::stoi(argv[1]);
    int size = std::stoi(argv[2]) / sizeof(Type);

    std::vector<Type> data(size, 0);
    std::vector<Type*> pointers;
    for (int i = 0; i < size; i++)
    {
        data[i] = i;
        pointers.push_back(data.data() + i);
    }

    if (shuffle == 1)
    {
        std::default_random_engine rng;
        rng.seed(0);
        std::shuffle(pointers.begin(), pointers.end(), rng);
    }

    test_memory(pointers);

    return 0;
}